

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadRegion.cpp
# Opt level: O1

string * __thiscall
ThreadRegion::dotName_abi_cxx11_(string *__return_storage_ptr__,ThreadRegion *this)

{
  uint uVar1;
  uint __val;
  long lVar2;
  uint uVar3;
  long *plVar4;
  uint uVar5;
  size_type *psVar6;
  ulong uVar7;
  uint __len;
  string __str;
  long *local_50 [2];
  long local_40 [2];
  
  uVar1 = this->id_;
  __val = -uVar1;
  if (0 < (int)uVar1) {
    __val = uVar1;
  }
  __len = 1;
  if (9 < __val) {
    uVar7 = (ulong)__val;
    uVar3 = 4;
    do {
      __len = uVar3;
      uVar5 = (uint)uVar7;
      if (uVar5 < 100) {
        __len = __len - 2;
        goto LAB_0011fceb;
      }
      if (uVar5 < 1000) {
        __len = __len - 1;
        goto LAB_0011fceb;
      }
      if (uVar5 < 10000) goto LAB_0011fceb;
      uVar7 = uVar7 / 10000;
      uVar3 = __len + 4;
    } while (99999 < uVar5);
    __len = __len + 1;
  }
LAB_0011fceb:
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_50[0] + (ulong)(uVar1 >> 0x1f)),__len,__val);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x121366);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar6) {
    lVar2 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ThreadRegion::dotName() { return "cluster" + std::to_string(id_); }